

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# split.cpp
# Opt level: O0

void __thiscall
SplitSVTest_three_words_Test<char8_t>::SplitSVTest_three_words_Test
          (SplitSVTest_three_words_Test<char8_t> *this)

{
  SplitSVTest_three_words_Test<char8_t> *this_local;
  
  SplitSVTest<char8_t>::SplitSVTest(&this->super_SplitSVTest<char8_t>);
  *(undefined ***)&this->super_SplitSVTest<char8_t> = &PTR__SplitSVTest_three_words_Test_0081ac18;
  return;
}

Assistant:

TYPED_TEST(SplitSVTest, three_words) {
	auto word = make_word<TypeParam>(3);
	word += default_delim<TypeParam>;
	word += make_word<TypeParam>(5);
	word += default_delim<TypeParam>;
	word += make_word<TypeParam>(9);
	std::basic_string_view<TypeParam> words = word;
	std::vector<std::basic_string<TypeParam>> split_result = split(words, default_delim<TypeParam>);
	EXPECT_EQ(split_result.size(), 3);
	EXPECT_EQ(split_result[0].size(), 3);
	EXPECT_EQ(split_result[1].size(), 5);
	EXPECT_EQ(split_result[2].size(), 9);
}